

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

Ifd_Man_t * Ifd_ManStart(void)

{
  int iVar1;
  Ifd_Man_t *pIVar2;
  Ifd_Obj_t *pIVar3;
  Vec_Int_t *pVVar4;
  Hsh_IntMan_t *pHVar5;
  Vec_Wrd_t *pVVar6;
  Ifd_Man_t *p;
  
  pIVar2 = (Ifd_Man_t *)calloc(1,0x48);
  iVar1 = Abc_PrimeCudd(50000000);
  pIVar2->nObjsAlloc = iVar1;
  pIVar2->nObjs = 2;
  pIVar3 = (Ifd_Obj_t *)calloc((long)pIVar2->nObjsAlloc,0x10);
  pIVar2->pObjs = pIVar3;
  memset(pIVar2->pObjs,0xff,0x10);
  *(uint *)(pIVar2->pObjs + 1) = *(uint *)(pIVar2->pObjs + 1) & 0xe0ffffff | 0x1000000;
  *(uint *)(pIVar2->pObjs + 1) = *(uint *)(pIVar2->pObjs + 1) & 0x7fffffff | 0x80000000;
  pVVar4 = Vec_IntAlloc(4000);
  pIVar2->vArgs = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pIVar2->vRes = pVVar4;
  pHVar5 = Hsh_IntManStart(pIVar2->vArgs,4,1000);
  pIVar2->vHash = pHVar5;
  pVVar4 = Vec_IntAlloc(100);
  pIVar2->vMarks = pVVar4;
  Vec_IntPush(pIVar2->vMarks,0);
  Vec_IntPush(pIVar2->vMarks,1);
  Vec_IntPush(pIVar2->vMarks,pIVar2->nObjs);
  pVVar4 = Vec_IntAlloc(1000);
  pIVar2->vSuper = pVVar4;
  pVVar6 = Vec_WrdAlloc(1000);
  pIVar2->vTruths = pVVar6;
  pVVar4 = Vec_IntAlloc(1000);
  pIVar2->vClauses = pVVar4;
  return pIVar2;
}

Assistant:

Ifd_Man_t * Ifd_ManStart()
{
    Ifd_Man_t * p;
    p = ABC_CALLOC( Ifd_Man_t, 1 );
    p->nObjsAlloc = Abc_PrimeCudd( 50000000 );
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Ifd_Obj_t, p->nObjsAlloc );
    memset( p->pObjs, 0xFF, sizeof(Ifd_Obj_t) ); // const node
    (p->pObjs + 1)->nSupp = 1;  // variable
    (p->pObjs + 1)->fWay  = 1;  // variable
    // hashing operations
    p->vArgs      = Vec_IntAlloc( 4000 );
    p->vRes       = Vec_IntAlloc( 1000 );
    p->vHash      = Hsh_IntManStart( p->vArgs, 4, 1000 );
    p->vMarks     = Vec_IntAlloc( 100 );
    Vec_IntPush( p->vMarks, 0 );
    Vec_IntPush( p->vMarks, 1 );
    Vec_IntPush( p->vMarks, p->nObjs );
    // other data
    p->vSuper     = Vec_IntAlloc( 1000 );
    p->vTruths    = Vec_WrdAlloc( 1000 );
    p->vClauses   = Vec_IntAlloc( 1000 );
    return p;
}